

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Socket::makeLinger(Socket *this,bool enabled)

{
  int iVar1;
  uint local_24 [2];
  linger so_linger;
  bool enabled_local;
  Socket *this_local;
  
  local_24[0] = (uint)enabled;
  local_24[1] = 0;
  so_linger.l_onoff._3_1_ = enabled;
  unique0x1000004a = this;
  iVar1 = setsockopt(this->_fd,1,0xd,local_24,8);
  return iVar1 != -1;
}

Assistant:

bool Socket::makeLinger( bool enabled )
{
    struct linger so_linger;
    so_linger.l_onoff = enabled ? 1 : 0;
    so_linger.l_linger = 0;
    if(setsockopt(_fd, SOL_SOCKET, SO_LINGER, (const char *)&so_linger, sizeof(so_linger)) == SOCKET_ERROR)
        return false;
    return true;
}